

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeExnData
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Name tag,
          Literals *payload)

{
  char **__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t local_50;
  Name tag_local;
  shared_ptr<wasm::ExnData> allocation;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  local_50 = tag.super_IString.str._M_len;
  __args = &tag_local.super_IString.str._M_str;
  std::make_shared<wasm::ExnData,wasm::Name&,wasm::Literals_const&>
            ((Name *)__args,(Literals *)&local_50);
  this_00 = &allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *)__args);
  ::wasm::Literal::Literal(__return_storage_ptr__,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&allocation);
  return __return_storage_ptr__;
}

Assistant:

Literal makeExnData(Name tag, const Literals& payload) {
    auto allocation = std::make_shared<ExnData>(tag, payload);
#if __has_feature(leak_sanitizer) || __has_feature(address_sanitizer)
    __lsan_ignore_object(allocation.get());
#endif
    return Literal(allocation);
  }